

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_header_debug(bcf_hdr_t *hdr)

{
  int local_18;
  int local_14;
  int j;
  int i;
  bcf_hdr_t *hdr_local;
  
  for (local_14 = 0; local_14 < hdr->nhrec; local_14 = local_14 + 1) {
    if (hdr->hrec[local_14]->value == (char *)0x0) {
      fprintf(_stderr,"##%s=<",hdr->hrec[local_14]->key);
      fprintf(_stderr,"%s=%s",*hdr->hrec[local_14]->keys,*hdr->hrec[local_14]->vals);
      local_18 = 1;
      while( true ) {
        if (hdr->hrec[local_14]->nkeys <= local_18) break;
        fprintf(_stderr,",%s=%s",hdr->hrec[local_14]->keys[local_18],
                hdr->hrec[local_14]->vals[local_18]);
        local_18 = local_18 + 1;
      }
      fprintf(_stderr,">\n");
    }
    else {
      fprintf(_stderr,"##%s=%s\n",hdr->hrec[local_14]->key,hdr->hrec[local_14]->value);
    }
  }
  return;
}

Assistant:

void bcf_header_debug(bcf_hdr_t *hdr)
{
    int i, j;
    for (i=0; i<hdr->nhrec; i++)
    {
        if ( !hdr->hrec[i]->value )
        {
            fprintf(stderr, "##%s=<", hdr->hrec[i]->key);
            fprintf(stderr,"%s=%s", hdr->hrec[i]->keys[0], hdr->hrec[i]->vals[0]);
            for (j=1; j<hdr->hrec[i]->nkeys; j++)
                fprintf(stderr,",%s=%s", hdr->hrec[i]->keys[j], hdr->hrec[i]->vals[j]);
            fprintf(stderr,">\n");
        }
        else
            fprintf(stderr,"##%s=%s\n", hdr->hrec[i]->key,hdr->hrec[i]->value);
    }
}